

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(TextReader<fmt::Locale> *this)

{
  long *in_RDI;
  char c;
  ArgList *in_stack_00000038;
  char *in_stack_00000040;
  TextReader<fmt::Locale> *in_stack_00000048;
  CStringRef in_stack_00000050;
  ArgList local_28;
  BasicCStringRef<char> local_18;
  char local_9;
  
  do {
    local_9 = *(char *)*in_RDI;
    if (local_9 == '\0') {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,"expected newline");
      fmt::ArgList::ArgList(&local_28);
      DoReportError(in_stack_00000048,in_stack_00000040,in_stack_00000050,in_stack_00000038);
      return;
    }
    *in_RDI = *in_RDI + 1;
  } while (local_9 != '\n');
  in_RDI[8] = *in_RDI;
  *(int *)(in_RDI + 9) = (int)in_RDI[9] + 1;
  return;
}

Assistant:

void ReadTillEndOfLine() {
    while (char c = *ptr_) {
      ++ptr_;
      if (c == '\n') {
        line_start_ = ptr_;
        ++line_;
        return;
      }
    }
    DoReportError(ptr_, "expected newline");
  }